

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O2

void Curl_mime_unpause(curl_mimepart *part)

{
  curl_mimepart *part_00;
  
  if (part != (curl_mimepart *)0x0) {
    if (part->lastreadstatus == 0x10000001) {
      part->lastreadstatus = 1;
    }
    if ((part->kind == MIMEKIND_MULTIPART) &&
       (part_00 = (curl_mimepart *)part->arg, part_00 != (curl_mimepart *)0x0)) {
      while (part_00 = part_00->nextpart, part_00 != (curl_mimepart *)0x0) {
        Curl_mime_unpause(part_00);
      }
    }
  }
  return;
}

Assistant:

void Curl_mime_unpause(curl_mimepart *part)
{
  if(part) {
    if(part->lastreadstatus == CURL_READFUNC_PAUSE)
      part->lastreadstatus = 1; /* Successful read status. */
    if(part->kind == MIMEKIND_MULTIPART) {
      curl_mime *mime = (curl_mime *) part->arg;

      if(mime) {
        curl_mimepart *subpart;

        for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart)
          Curl_mime_unpause(subpart);
      }
    }
  }
}